

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadLght_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  Node *msh;
  long *plVar1;
  int *piVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Light *__p;
  _Elt_pointer psVar8;
  LineSplitter *splitter_00;
  Logger *pLVar9;
  Assimp *pAVar10;
  range_error *this_00;
  Assimp AVar11;
  ChunkInfo *pCVar12;
  ulong uVar13;
  LineSplitter *this_01;
  char *rgb;
  ai_real ret;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  long local_1d8;
  Assimp *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (8 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Lght");
    return;
  }
  pCVar12 = nfo;
  __p = (Light *)operator_new(0xf0);
  COB::Node::Node((Node *)__p,TYPE_LIGHT);
  (__p->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00800080;
  *(undefined8 *)&(__p->super_Node).field_0xd4 = 0;
  *(undefined8 *)&__p->field_0xdc = 0;
  __p->inner_angle = 0.0;
  __p->ltype = SPOT;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Light*>
            (&_Stack_1e0,__p);
  local_1a8._8_8_ = _Stack_1e0._M_pi;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1a8._0_8_ = __p;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,(shared_ptr<Assimp::COB::Node> *)local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  psVar8 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar8 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar12 = (ChunkInfo *)
              (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar8 = (_Elt_pointer)(*(long *)&pCVar12[-1].version + 0x200);
  }
  msh = psVar8[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar6 = nfo->parent_id;
  uVar4 = nfo->version;
  uVar5 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar6;
  (msh->super_ChunkInfo).version = uVar4;
  (msh->super_ChunkInfo).size = uVar5;
  this_01 = splitter;
  splitter_00 = LineSplitter::operator++(splitter);
  ReadBasicNodeInfo_Ascii((COBImporter *)this_01,msh,splitter_00,pCVar12);
  uVar13 = (splitter->mCur)._M_string_length;
  if ((uVar13 < 9) ||
     (plVar1 = (long *)(splitter->mCur)._M_dataplus._M_p,
     (char)plVar1[1] != ' ' || *plVar1 != 0x6574696e69666e49)) {
    if ((uVar13 < 6) ||
       (piVar2 = (int *)(splitter->mCur)._M_dataplus._M_p,
       (short)piVar2[1] != 0x206c || *piVar2 != 0x61636f4c)) {
      if ((uVar13 < 5) ||
         (piVar2 = (int *)(splitter->mCur)._M_dataplus._M_p,
         (char)piVar2[1] != ' ' || *piVar2 != 0x746f7053)) {
        pLVar9 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[46]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [46])"Unknown kind of light source in `Lght` chunk ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
        pcVar3 = (splitter->mCur)._M_dataplus._M_p;
        local_1c8 = (Assimp *)local_1b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,pcVar3,pcVar3 + (splitter->mCur)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar9,(char *)0x0);
        if (&stack0x00000000 != (undefined1 *)0x1d8) {
          operator_delete((void *)0x0,local_1d8 + 1);
        }
        if (local_1c8 != (Assimp *)local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      uVar6 = 0;
    }
    else {
      uVar6 = 1;
    }
  }
  else {
    uVar6 = 2;
  }
  msh[1].super_ChunkInfo.version = uVar6;
  LineSplitter::operator++(splitter);
  if (((splitter->mCur)._M_string_length < 6) ||
     (piVar2 = (int *)(splitter->mCur)._M_dataplus._M_p,
     (short)piVar2[1] != 0x2072 || *piVar2 != 0x6f6c6f63)) {
    pLVar9 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[39]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [39])"Expected `color` line in `Lght` chunk ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar9,(char *)0x0);
    if (&stack0x00000000 != (undefined1 *)0x1d8) {
      operator_delete((void *)0x0,local_1d8 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  for (pAVar10 = (Assimp *)(splitter->mCur)._M_dataplus._M_p;
      (*pAVar10 == (Assimp)0x9 || (*pAVar10 == (Assimp)0x20)); pAVar10 = pAVar10 + 1) {
  }
  do {
    uVar13 = (ulong)(byte)*pAVar10;
    if (uVar13 < 0x21) {
      if ((0x100000200U >> (uVar13 & 0x3f) & 1) != 0) {
        for (; (AVar11 = *pAVar10, AVar11 == (Assimp)0x20 || (AVar11 == (Assimp)0x9));
            pAVar10 = pAVar10 + 1) {
        }
        local_1c8 = pAVar10;
        ReadFloat3Tuple_Ascii<aiColor3D>(this,(aiColor3D *)&msh->field_0xd4,(char **)&local_1c8);
        for (; (*local_1c8 == (Assimp)0x20 || (*local_1c8 == (Assimp)0x9));
            local_1c8 = local_1c8 + 1) {
        }
        iVar7 = strncmp((char *)local_1c8,"cone angle",10);
        if (iVar7 != 0) {
          pLVar9 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[62]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [62])"Expected `cone angle` entity in `color` line in `Lght` chunk ")
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar9,(char *)0x0);
          if (&stack0x00000000 != (undefined1 *)0x1d8) {
            operator_delete((void *)0x0,local_1d8 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        for (local_1c8 = local_1c8 + 10; (*local_1c8 == (Assimp)0x20 || (*local_1c8 == (Assimp)0x9))
            ; local_1c8 = local_1c8 + 1) {
        }
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
        local_1c8 = (Assimp *)
                    fast_atoreal_move<float>(local_1c8,local_1a8,(float *)0x1,(bool)AVar11);
        msh[1].super_ChunkInfo.id = local_1a8._0_4_;
        for (; (AVar11 = *local_1c8, AVar11 == (Assimp)0x20 || (AVar11 == (Assimp)0x9));
            local_1c8 = local_1c8 + 1) {
        }
        iVar7 = strncmp((char *)local_1c8,"inner angle",0xb);
        if (iVar7 != 0) {
          pLVar9 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[63]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [63])"Expected `inner angle` entity in `color` line in `Lght` chunk "
                    );
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar9,(char *)0x0);
          if (&stack0x00000000 != (undefined1 *)0x1d8) {
            operator_delete((void *)0x0,local_1d8 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        for (local_1c8 = local_1c8 + 0xb;
            (*local_1c8 == (Assimp)0x20 || (*local_1c8 == (Assimp)0x9)); local_1c8 = local_1c8 + 1)
        {
        }
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
        fast_atoreal_move<float>(local_1c8,local_1a8,(float *)0x1,(bool)AVar11);
        msh[1].super_ChunkInfo.parent_id = local_1a8._0_4_;
        return;
      }
      if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
        this_00 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_00,"Token index out of range, EOL reached");
        __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
      }
    }
    pAVar10 = pAVar10 + 1;
  } while( true );
}

Assistant:

void COBImporter::ReadLght_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Lght");
    }

    out.nodes.push_back(std::shared_ptr<Light>(new Light()));
    Light& msh = (Light&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    if (splitter.match_start("Infinite ")) {
        msh.ltype = Light::INFINITE;
    }
    else if (splitter.match_start("Local ")) {
        msh.ltype = Light::LOCAL;
    }
    else if (splitter.match_start("Spot ")) {
        msh.ltype = Light::SPOT;
    }
    else {
        ASSIMP_LOG_WARN_F( "Unknown kind of light source in `Lght` chunk ", nfo.id, " : ", *splitter );
        msh.ltype = Light::SPOT;
    }

    ++splitter;
    if (!splitter.match_start("color ")) {
        ASSIMP_LOG_WARN_F( "Expected `color` line in `Lght` chunk ", nfo.id );
    }

    const char* rgb = splitter[1];
    ReadFloat3Tuple_Ascii(msh.color ,&rgb);

    SkipSpaces(&rgb);
    if (strncmp(rgb,"cone angle",10) != 0) {
        ASSIMP_LOG_WARN_F( "Expected `cone angle` entity in `color` line in `Lght` chunk ", nfo.id );
    }
    SkipSpaces(rgb+10,&rgb);
    msh.angle = fast_atof(&rgb);

    SkipSpaces(&rgb);
    if (strncmp(rgb,"inner angle",11) != 0) {
        ASSIMP_LOG_WARN_F( "Expected `inner angle` entity in `color` line in `Lght` chunk ", nfo.id);
    }
    SkipSpaces(rgb+11,&rgb);
    msh.inner_angle = fast_atof(&rgb);

    // skip the rest for we can't handle this kind of physically-based lighting information.
}